

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_block_error_intrin_avx2.c
# Opt level: O0

int64_t av1_highbd_block_error_avx2
                  (tran_low_t *coeff,tran_low_t *dqcoeff,intptr_t block_size,int64_t *ssz,int bps)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  byte bVar8;
  int iVar9;
  long *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  char in_R8B;
  undefined1 auVar10 [32];
  __m256i res_sqcoeff;
  __m256i mm256_coeffh2;
  __m256i mm256_coeffh;
  __m256i res_diff;
  __m256i res3;
  __m256i res2;
  __m256i res1;
  __m256i res;
  __m256i diff2h;
  __m256i diff1h;
  __m256i diff2;
  __m256i diff1;
  __m256i mm256_dqcoeff2;
  __m256i mm256_dqcoeff;
  __m256i mm256_coeff2;
  __m256i mm256_coeff;
  int rounding;
  int shift;
  int64_t sqcoeff;
  int64_t error;
  int64_t temp1 [8];
  int i;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_640;
  undefined8 local_638;
  undefined4 local_5e8;
  
  local_638 = 0;
  local_640 = 0;
  bVar8 = (in_R8B + -8) * '\x02';
  iVar9 = (1 << (bVar8 & 0x1f)) >> 1;
  for (local_5e8 = 0; local_5e8 < in_RDX; local_5e8 = local_5e8 + 0x10) {
    pauVar1 = (undefined1 (*) [32])(in_RDI + (long)local_5e8 * 4);
    pauVar2 = (undefined1 (*) [32])(in_RDI + 0x20 + (long)local_5e8 * 4);
    auVar6 = vpsubd_avx2(*pauVar1,*(undefined1 (*) [32])(in_RSI + (long)local_5e8 * 4));
    auVar7 = vpsubd_avx2(*pauVar2,*(undefined1 (*) [32])(in_RSI + 0x20 + (long)local_5e8 * 4));
    auVar3 = vpsrlq_avx2(auVar6,ZEXT416(0x20));
    auVar4 = vpsrlq_avx2(auVar7,ZEXT416(0x20));
    auVar6 = vpmuldq_avx2(auVar6,auVar6);
    auVar3 = vpmuldq_avx2(auVar3,auVar3);
    auVar7 = vpmuldq_avx2(auVar7,auVar7);
    auVar4 = vpmuldq_avx2(auVar4,auVar4);
    auVar6 = vpaddq_avx2(auVar6,auVar3);
    auVar3 = vpaddq_avx2(auVar7,auVar4);
    auVar6 = vpaddq_avx2(auVar6,auVar3);
    auVar7 = vpsrlq_avx2(*pauVar1,ZEXT416(0x20));
    auVar5 = vpsrlq_avx2(*pauVar2,ZEXT416(0x20));
    auVar3 = vpmuldq_avx2(*pauVar1,*pauVar1);
    auVar7 = vpmuldq_avx2(auVar7,auVar7);
    auVar4 = vpmuldq_avx2(*pauVar2,*pauVar2);
    auVar10 = vpsllq_avx2(auVar5,0x20);
    auVar10 = vpsrad_avx2(auVar10,0x1f);
    vpblendd_avx2(auVar5,auVar10,0xaa);
    auVar10 = vpsllq_avx2(auVar5,0x20);
    auVar10 = vpsrad_avx2(auVar10,0x1f);
    vpblendd_avx2(auVar5,auVar10,0xaa);
    auVar5 = vpmuldq_avx2(auVar5,auVar5);
    auVar3 = vpaddq_avx2(auVar3,auVar7);
    auVar7 = vpaddq_avx2(auVar4,auVar5);
    auVar3 = vpaddq_avx2(auVar3,auVar7);
    local_800 = auVar6._0_8_;
    uStack_7f8 = auVar6._8_8_;
    uStack_7f0 = auVar6._16_8_;
    uStack_7e8 = auVar6._24_8_;
    local_860 = auVar3._0_8_;
    uStack_858 = auVar3._8_8_;
    uStack_850 = auVar3._16_8_;
    uStack_848 = auVar3._24_8_;
    local_638 = local_800 + uStack_7f8 + uStack_7f0 + uStack_7e8 + local_638;
    local_640 = local_860 + uStack_858 + uStack_850 + uStack_848 + local_640;
  }
  *in_RCX = local_640 + iVar9 >> (bVar8 & 0x3f);
  return local_638 + iVar9 >> (bVar8 & 0x3f);
}

Assistant:

int64_t av1_highbd_block_error_avx2(const tran_low_t *coeff,
                                    const tran_low_t *dqcoeff,
                                    intptr_t block_size, int64_t *ssz,
                                    int bps) {
  int i;
  int64_t temp1[8];
  int64_t error = 0, sqcoeff = 0;
  const int shift = 2 * (bps - 8);
  const int rounding = (1 << shift) >> 1;

  for (i = 0; i < block_size; i += 16) {
    __m256i mm256_coeff = _mm256_loadu_si256((__m256i *)(coeff + i));
    __m256i mm256_coeff2 = _mm256_loadu_si256((__m256i *)(coeff + i + 8));
    __m256i mm256_dqcoeff = _mm256_loadu_si256((__m256i *)(dqcoeff + i));
    __m256i mm256_dqcoeff2 = _mm256_loadu_si256((__m256i *)(dqcoeff + i + 8));

    __m256i diff1 = _mm256_sub_epi32(mm256_coeff, mm256_dqcoeff);
    __m256i diff2 = _mm256_sub_epi32(mm256_coeff2, mm256_dqcoeff2);
    __m256i diff1h = _mm256_srli_epi64(diff1, 32);
    __m256i diff2h = _mm256_srli_epi64(diff2, 32);
    __m256i res = _mm256_mul_epi32(diff1, diff1);
    __m256i res1 = _mm256_mul_epi32(diff1h, diff1h);
    __m256i res2 = _mm256_mul_epi32(diff2, diff2);
    __m256i res3 = _mm256_mul_epi32(diff2h, diff2h);
    __m256i res_diff = _mm256_add_epi64(_mm256_add_epi64(res, res1),
                                        _mm256_add_epi64(res2, res3));
    __m256i mm256_coeffh = _mm256_srli_epi64(mm256_coeff, 32);
    __m256i mm256_coeffh2 = _mm256_srli_epi64(mm256_coeff2, 32);
    res = _mm256_mul_epi32(mm256_coeff, mm256_coeff);
    res1 = _mm256_mul_epi32(mm256_coeffh, mm256_coeffh);
    res2 = _mm256_mul_epi32(mm256_coeff2, mm256_coeff2);
    res3 = _mm256_mul_epi32(mm256_coeffh2, mm256_coeffh2);
    __m256i res_sqcoeff = _mm256_add_epi64(_mm256_add_epi64(res, res1),
                                           _mm256_add_epi64(res2, res3));
    _mm256_storeu_si256((__m256i *)temp1, res_diff);
    _mm256_storeu_si256((__m256i *)temp1 + 1, res_sqcoeff);

    error += temp1[0] + temp1[1] + temp1[2] + temp1[3];
    sqcoeff += temp1[4] + temp1[5] + temp1[6] + temp1[7];
  }
  error = (error + rounding) >> shift;
  sqcoeff = (sqcoeff + rounding) >> shift;

  *ssz = sqcoeff;
  return error;
}